

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Calls.cpp
# Opt level: O0

RWNode * __thiscall
dg::dda::LLVMReadWriteGraphBuilder::createPthreadJoinCall
          (LLVMReadWriteGraphBuilder *this,CallInst *CInst)

{
  RWNode *pRVar1;
  RWNode **in_RDI;
  RWNode *node;
  CallInst *in_stack_000000f0;
  LLVMReadWriteGraphBuilder *in_stack_000000f8;
  CallInst **in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffe0;
  undefined7 in_stack_ffffffffffffffe1;
  
  pRVar1 = createUnknownCall(in_stack_000000f8,in_stack_000000f0);
  std::
  map<llvm::CallInst_const*,dg::dda::RWNode*,std::less<llvm::CallInst_const*>,std::allocator<std::pair<llvm::CallInst_const*const,dg::dda::RWNode*>>>
  ::emplace<llvm::CallInst_const*&,dg::dda::RWNode*&>
            ((map<const_llvm::CallInst_*,_dg::dda::RWNode_*,_std::less<const_llvm::CallInst_*>,_std::allocator<std::pair<const_llvm::CallInst_*const,_dg::dda::RWNode_*>_>_>
              *)CONCAT71(in_stack_ffffffffffffffe1,in_stack_ffffffffffffffe0),
             in_stack_ffffffffffffffd8,in_RDI);
  return pRVar1;
}

Assistant:

RWNode *
LLVMReadWriteGraphBuilder::createPthreadJoinCall(const llvm::CallInst *CInst) {
    // TODO later change this to create join node and set data correctly
    // we need just to create one node;
    // undefined call is overapproximation, so its ok
    RWNode *node = createUnknownCall(CInst);
    threadJoinCalls.emplace(CInst, node);
    return node;
}